

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O3

void SzArEx_Free(CSzArEx *p,ISzAlloc *alloc)

{
  (*alloc->Free)(alloc,p->UnpackPositions);
  (*alloc->Free)(alloc,p->IsDirs);
  (*alloc->Free)(alloc,p->FolderToFile);
  (*alloc->Free)(alloc,p->FileToFolder);
  (*alloc->Free)(alloc,p->FileNameOffsets);
  (*alloc->Free)(alloc,p->FileNames);
  (*alloc->Free)(alloc,(p->CRCs).Defs);
  (p->CRCs).Defs = (Byte *)0x0;
  (*alloc->Free)(alloc,(p->CRCs).Vals);
  (p->CRCs).Vals = (UInt32 *)0x0;
  (*alloc->Free)(alloc,(p->Attribs).Defs);
  (p->Attribs).Defs = (Byte *)0x0;
  (*alloc->Free)(alloc,(p->Attribs).Vals);
  (p->Attribs).Vals = (UInt32 *)0x0;
  (*alloc->Free)(alloc,(p->MTime).Defs);
  (p->MTime).Defs = (Byte *)0x0;
  (*alloc->Free)(alloc,(p->MTime).Vals);
  (p->MTime).Vals = (CNtfsFileTime *)0x0;
  (*alloc->Free)(alloc,(p->CTime).Defs);
  (p->CTime).Defs = (Byte *)0x0;
  (*alloc->Free)(alloc,(p->CTime).Vals);
  (p->CTime).Vals = (CNtfsFileTime *)0x0;
  SzAr_Free(&p->db,alloc);
  (p->db).CoderUnpackSizes = (UInt64 *)0x0;
  (p->db).CodersData = (Byte *)0x0;
  (p->db).FoToCoderUnpackSizes = (UInt32 *)0x0;
  (p->db).FoToMainUnpackSizeIndex = (Byte *)0x0;
  (p->db).FoCodersOffsets = (size_t *)0x0;
  (p->db).FoStartPackStreamIndex = (UInt32 *)0x0;
  (p->db).FolderCRCs.Defs = (Byte *)0x0;
  (p->db).FolderCRCs.Vals = (UInt32 *)0x0;
  (p->db).NumPackStreams = 0;
  (p->db).NumFolders = 0;
  (p->db).PackPositions = (UInt64 *)0x0;
  p->NumFiles = 0;
  p->dataPos = 0;
  p->UnpackPositions = (UInt64 *)0x0;
  p->IsDirs = (Byte *)0x0;
  (p->CRCs).Defs = (Byte *)0x0;
  (p->CRCs).Vals = (UInt32 *)0x0;
  (p->Attribs).Defs = (Byte *)0x0;
  (p->Attribs).Vals = (UInt32 *)0x0;
  (p->MTime).Defs = (Byte *)0x0;
  (p->MTime).Vals = (CNtfsFileTime *)0x0;
  (p->CTime).Defs = (Byte *)0x0;
  (p->CTime).Vals = (CNtfsFileTime *)0x0;
  p->FolderToFile = (UInt32 *)0x0;
  p->FileToFolder = (UInt32 *)0x0;
  p->FileNameOffsets = (size_t *)0x0;
  p->FileNames = (Byte *)0x0;
  return;
}

Assistant:

void SzArEx_Free(CSzArEx *p, ISzAlloc *alloc)
{
  IAlloc_Free(alloc, p->UnpackPositions);
  IAlloc_Free(alloc, p->IsDirs);

  IAlloc_Free(alloc, p->FolderToFile);
  IAlloc_Free(alloc, p->FileToFolder);

  IAlloc_Free(alloc, p->FileNameOffsets);
  IAlloc_Free(alloc, p->FileNames);

  SzBitUi32s_Free(&p->CRCs, alloc);
  SzBitUi32s_Free(&p->Attribs, alloc);
  // SzBitUi32s_Free(&p->Parents, alloc);
  SzBitUi64s_Free(&p->MTime, alloc);
  SzBitUi64s_Free(&p->CTime, alloc);
  
  SzAr_Free(&p->db, alloc);
  SzArEx_Init(p);
}